

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_input_auth(connectdata *conn,_Bool proxy,char *auth)

{
  undefined1 *puVar1;
  char *pcVar2;
  long lVar3;
  byte *pbVar4;
  byte bVar5;
  Curl_easy *data;
  long lVar6;
  _Bool _Var7;
  int iVar8;
  CURLcode CVar9;
  ulong uVar10;
  undefined7 in_register_00000031;
  ulong uVar11;
  
  data = conn->data;
  uVar11 = (ulong)(uint)((int)CONCAT71(in_register_00000031,proxy) << 5);
  lVar3 = (ulong)!proxy * 8;
  do {
    if (*auth == 0) {
      return CURLE_OK;
    }
    iVar8 = curl_strnequal("NTLM",auth,4);
    if (iVar8 == 0) {
      iVar8 = curl_strnequal("Digest",auth,6);
      if (iVar8 == 0) {
        iVar8 = curl_strnequal("Basic",auth,5);
        if (iVar8 == 0) {
          iVar8 = curl_strnequal("Bearer",auth,6);
          if (iVar8 != 0) {
            pcVar2 = (data->info).conn_primary_ip + lVar3 + -0x28;
            *pcVar2 = *pcVar2 | 0x40;
            pbVar4 = (byte *)((long)&(data->state).authhost.avail + uVar11);
            *pbVar4 = *pbVar4 | 0x40;
            if (*(long *)((long)&(data->state).authhost.picked + uVar11) == 0x40) goto LAB_00405c0d;
          }
        }
        else {
          pcVar2 = (data->info).conn_primary_ip + lVar3 + -0x28;
          *pcVar2 = *pcVar2 | 1;
          pbVar4 = (byte *)((long)&(data->state).authhost.avail + uVar11);
          *pbVar4 = *pbVar4 | 1;
          if (*(long *)((long)&(data->state).authhost.picked + uVar11) == 1) {
LAB_00405c0d:
            *(undefined8 *)((long)&(data->state).authhost.avail + uVar11) = 0;
            goto LAB_00405c13;
          }
        }
      }
      else if ((*(byte *)((long)&(data->state).authhost.avail + uVar11) & 2) == 0) {
        _Var7 = Curl_auth_is_digest_supported();
        if (_Var7) {
          pcVar2 = (data->info).conn_primary_ip + lVar3 + -0x28;
          *pcVar2 = *pcVar2 | 2;
          pbVar4 = (byte *)((long)&(data->state).authhost.avail + uVar11);
          *pbVar4 = *pbVar4 | 2;
          CVar9 = Curl_input_digest(conn,proxy,auth);
          if (CVar9 != CURLE_OK) goto LAB_00405c13;
        }
      }
      else {
        Curl_infof(data,"Ignoring duplicate digest auth header.\n");
      }
    }
    else {
      uVar10 = *(ulong *)((long)&(data->state).authhost.avail + uVar11);
      if ((uVar10 & 0x28) == 0) {
        _Var7 = Curl_auth_is_ntlm_supported();
        if (!_Var7) goto LAB_00405c31;
        uVar10 = *(ulong *)((long)&(data->state).authhost.avail + uVar11);
      }
      pcVar2 = (data->info).conn_primary_ip + lVar3 + -0x28;
      *pcVar2 = *pcVar2 | 8;
      *(ulong *)((long)&(data->state).authhost.avail + uVar11) = uVar10 | 8;
      lVar6 = *(long *)((long)&(data->state).authhost.picked + uVar11);
      if ((lVar6 == 0x20) || (lVar6 == 8)) {
        CVar9 = Curl_input_ntlm(conn,proxy,auth);
        if (CVar9 == CURLE_OK) {
          puVar1 = &(data->state).field_0x4e4;
          *puVar1 = *puVar1 & 0xdf;
        }
        else {
LAB_00405c13:
          Curl_infof(data,"Authentication problem. Ignoring this.\n");
          puVar1 = &(data->state).field_0x4e4;
          *puVar1 = *puVar1 | 0x20;
        }
      }
    }
LAB_00405c31:
    for (; (bVar5 = *auth, bVar5 != 0 && (bVar5 != 0x2c)); auth = (char *)((byte *)auth + 1)) {
    }
    auth = (char *)((byte *)auth + (bVar5 == 0x2c));
    while ((*auth != 0 && (iVar8 = Curl_isspace((uint)(byte)*auth), iVar8 != 0))) {
      auth = (char *)((byte *)auth + 1);
    }
  } while( true );
}

Assistant:

CURLcode Curl_http_input_auth(struct connectdata *conn, bool proxy,
                              const char *auth) /* the first non-space */
{
  /*
   * This resource requires authentication
   */
  struct Curl_easy *data = conn->data;

#ifdef USE_SPNEGO
  curlnegotiate *negstate = proxy ? &conn->proxy_negotiate_state :
                                    &conn->http_negotiate_state;
#endif
  unsigned long *availp;
  struct auth *authp;

  if(proxy) {
    availp = &data->info.proxyauthavail;
    authp = &data->state.authproxy;
  }
  else {
    availp = &data->info.httpauthavail;
    authp = &data->state.authhost;
  }

  /*
   * Here we check if we want the specific single authentication (using ==) and
   * if we do, we initiate usage of it.
   *
   * If the provided authentication is wanted as one out of several accepted
   * types (using &), we OR this authentication type to the authavail
   * variable.
   *
   * Note:
   *
   * ->picked is first set to the 'want' value (one or more bits) before the
   * request is sent, and then it is again set _after_ all response 401/407
   * headers have been received but then only to a single preferred method
   * (bit).
   */

  while(*auth) {
#ifdef USE_SPNEGO
    if(checkprefix("Negotiate", auth)) {
      if((authp->avail & CURLAUTH_NEGOTIATE) ||
         Curl_auth_is_spnego_supported()) {
        *availp |= CURLAUTH_NEGOTIATE;
        authp->avail |= CURLAUTH_NEGOTIATE;

        if(authp->picked == CURLAUTH_NEGOTIATE) {
          CURLcode result = Curl_input_negotiate(conn, proxy, auth);
          if(!result) {
            DEBUGASSERT(!data->req.newurl);
            data->req.newurl = strdup(data->change.url);
            if(!data->req.newurl)
              return CURLE_OUT_OF_MEMORY;
            data->state.authproblem = FALSE;
            /* we received a GSS auth token and we dealt with it fine */
            *negstate = GSS_AUTHRECV;
          }
          else
            data->state.authproblem = TRUE;
        }
      }
    }
    else
#endif
#ifdef USE_NTLM
      /* NTLM support requires the SSL crypto libs */
      if(checkprefix("NTLM", auth)) {
        if((authp->avail & CURLAUTH_NTLM) ||
           (authp->avail & CURLAUTH_NTLM_WB) ||
           Curl_auth_is_ntlm_supported()) {
          *availp |= CURLAUTH_NTLM;
          authp->avail |= CURLAUTH_NTLM;

          if(authp->picked == CURLAUTH_NTLM ||
             authp->picked == CURLAUTH_NTLM_WB) {
            /* NTLM authentication is picked and activated */
            CURLcode result = Curl_input_ntlm(conn, proxy, auth);
            if(!result) {
              data->state.authproblem = FALSE;
#ifdef NTLM_WB_ENABLED
              if(authp->picked == CURLAUTH_NTLM_WB) {
                *availp &= ~CURLAUTH_NTLM;
                authp->avail &= ~CURLAUTH_NTLM;
                *availp |= CURLAUTH_NTLM_WB;
                authp->avail |= CURLAUTH_NTLM_WB;

                result = Curl_input_ntlm_wb(conn, proxy, auth);
                if(result) {
                  infof(data, "Authentication problem. Ignoring this.\n");
                  data->state.authproblem = TRUE;
                }
              }
#endif
            }
            else {
              infof(data, "Authentication problem. Ignoring this.\n");
              data->state.authproblem = TRUE;
            }
          }
        }
      }
      else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
        if(checkprefix("Digest", auth)) {
          if((authp->avail & CURLAUTH_DIGEST) != 0)
            infof(data, "Ignoring duplicate digest auth header.\n");
          else if(Curl_auth_is_digest_supported()) {
            CURLcode result;

            *availp |= CURLAUTH_DIGEST;
            authp->avail |= CURLAUTH_DIGEST;

            /* We call this function on input Digest headers even if Digest
             * authentication isn't activated yet, as we need to store the
             * incoming data from this header in case we are going to use
             * Digest */
            result = Curl_input_digest(conn, proxy, auth);
            if(result) {
              infof(data, "Authentication problem. Ignoring this.\n");
              data->state.authproblem = TRUE;
            }
          }
        }
        else
#endif
          if(checkprefix("Basic", auth)) {
            *availp |= CURLAUTH_BASIC;
            authp->avail |= CURLAUTH_BASIC;
            if(authp->picked == CURLAUTH_BASIC) {
              /* We asked for Basic authentication but got a 40X back
                 anyway, which basically means our name+password isn't
                 valid. */
              authp->avail = CURLAUTH_NONE;
              infof(data, "Authentication problem. Ignoring this.\n");
              data->state.authproblem = TRUE;
            }
          }
          else
            if(checkprefix("Bearer", auth)) {
              *availp |= CURLAUTH_BEARER;
              authp->avail |= CURLAUTH_BEARER;
              if(authp->picked == CURLAUTH_BEARER) {
                /* We asked for Bearer authentication but got a 40X back
                  anyway, which basically means our token isn't valid. */
                authp->avail = CURLAUTH_NONE;
                infof(data, "Authentication problem. Ignoring this.\n");
                data->state.authproblem = TRUE;
              }
            }

    /* there may be multiple methods on one line, so keep reading */
    while(*auth && *auth != ',') /* read up to the next comma */
      auth++;
    if(*auth == ',') /* if we're on a comma, skip it */
      auth++;
    while(*auth && ISSPACE(*auth))
      auth++;
  }

  return CURLE_OK;
}